

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Chapters::~Chapters(Chapters *this)

{
  int iVar1;
  Edition *pEVar2;
  Edition *this_00;
  long in_RDI;
  Edition *e;
  
  while (0 < *(int *)(in_RDI + 0x34)) {
    iVar1 = *(int *)(in_RDI + 0x34);
    *(int *)(in_RDI + 0x34) = iVar1 + -1;
    Edition::Clear((Edition *)((long)iVar1 * 0x10 + -0x10 + *(long *)(in_RDI + 0x28)));
  }
  pEVar2 = *(Edition **)(in_RDI + 0x28);
  if (pEVar2 != (Edition *)0x0) {
    this_00 = pEVar2 + *(long *)&pEVar2[-1].m_atoms_size;
    while (pEVar2 != this_00) {
      this_00 = this_00 + -1;
      Edition::~Edition(this_00);
    }
    operator_delete__(&pEVar2[-1].m_atoms_size);
  }
  return;
}

Assistant:

Chapters::~Chapters() {
  while (m_editions_count > 0) {
    Edition& e = m_editions[--m_editions_count];
    e.Clear();
  }
  delete[] m_editions;
}